

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_set_covered
               (MultiFab *mf,int icomp,int ncomp,int ngrow,
               Vector<double,_std::allocator<double>_> *a_vals)

{
  BoxArray *this;
  pointer __src;
  IndexType IVar1;
  EBFArrayBoxFactory *this_00;
  FabArray<amrex::EBCellFlagFab> *this_01;
  long lVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int local_1d8;
  long local_188;
  Box local_144;
  Array4<double> local_128;
  DeviceVector<Real> vals_dv;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter mfi;
  
  this_00 = (EBFArrayBoxFactory *)
            __dynamic_cast((mf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo);
  if (this_00 != (EBFArrayBoxFactory *)0x0) {
    this_01 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
    this = &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
    IVar1 = BATransformer::index_type(&this->m_bat);
    if ((IVar1.itype != 0) && (IVar1 = BATransformer::index_type(&this->m_bat), IVar1.itype != 7)) {
      Assert_host("mf.ixType().cellCentered() || mf.ixType().nodeCentered()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
                  ,0x4b,(char *)0x0);
    }
    IVar1 = BATransformer::index_type(&this->m_bat);
    iVar8 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    if (iVar8 < ngrow) {
      ngrow = iVar8;
    }
    PODVector<double,_std::allocator<double>_>::PODVector
              (&vals_dv,(long)(a_vals->super_vector<double,_std::allocator<double>_>).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(a_vals->super_vector<double,_std::allocator<double>_>).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3);
    __src = (a_vals->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
    __n = (long)(a_vals->super_vector<double,_std::allocator<double>_>).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)__src;
    if (__n != 0) {
      memcpy(vals_dv.m_data,__src,__n);
    }
    MFIter::MFIter(&mfi,(FabArrayBase *)mf,true);
    if (ncomp < 1) {
      ncomp = 0;
    }
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::growntilebox(&local_144,&mfi,ngrow);
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>(&local_d0,this_01,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_128,&mf->super_FabArray<amrex::FArrayBox>,&mfi);
      lVar2 = (long)local_144.smallend.vect[0];
      if (IVar1.itype == 0) {
        lVar10 = (long)icomp << 3;
        for (uVar5 = 0; lVar18 = (long)local_144.smallend.vect[2], uVar5 != (uint)ncomp;
            uVar5 = uVar5 + 1) {
          for (; lVar3 = (long)local_144.smallend.vect[1], (int)lVar18 <= local_144.bigend.vect[2];
              lVar18 = lVar18 + 1) {
            for (; (int)lVar3 <= local_144.bigend.vect[1]; lVar3 = lVar3 + 1) {
              for (lVar4 = 0; lVar2 + lVar4 <= (long)local_144.bigend.vect[0]; lVar4 = lVar4 + 1) {
                if ((~local_d0.p
                      [lVar2 + (((lVar18 - local_d0.begin.z) * local_d0.kstride +
                                (lVar3 - local_d0.begin.y) * local_d0.jstride + lVar4) -
                               (long)local_d0.begin.x)].flag & 3) == 0) {
                  *(double *)
                   ((long)local_128.p +
                   lVar4 * 8 +
                   local_128.nstride * lVar10 +
                   (lVar18 - local_128.begin.z) * local_128.kstride * 8 +
                   (lVar3 - local_128.begin.y) * local_128.jstride * 8 +
                   (long)local_128.begin.x * -8 + lVar2 * 8) = vals_dv.m_data[uVar5];
                }
              }
            }
          }
          lVar10 = lVar10 + 8;
        }
      }
      else {
        local_188 = (long)icomp << 3;
        for (uVar5 = 0; lVar10 = (long)local_144.smallend.vect[2],
            local_1d8 = local_144.smallend.vect[2] + -1, uVar5 != (uint)ncomp; uVar5 = uVar5 + 1) {
          for (; iVar13 = (int)lVar10, lVar18 = (long)local_144.smallend.vect[1],
              iVar8 = local_144.smallend.vect[1] + -1, iVar13 <= local_144.bigend.vect[2];
              lVar10 = lVar10 + 1) {
            for (; iVar15 = (int)lVar18, iVar15 <= local_144.bigend.vect[1]; lVar18 = lVar18 + 1) {
              lVar9 = (long)local_d0.begin.x;
              lVar11 = (~local_d0.begin.z + iVar13) * local_d0.kstride;
              lVar12 = (iVar13 - local_d0.begin.z) * local_d0.kstride;
              lVar4 = (lVar10 - local_d0.begin.z) * local_d0.kstride * 4;
              lVar14 = (long)(local_1d8 - local_d0.begin.z) * local_d0.kstride * 4;
              lVar6 = (~local_d0.begin.y + iVar15) * local_d0.jstride;
              lVar16 = (iVar15 - local_d0.begin.y) * local_d0.jstride;
              lVar7 = (long)(iVar8 - local_d0.begin.y) * local_d0.jstride * 4;
              lVar3 = (lVar18 - local_d0.begin.y) * local_d0.jstride * 4;
              for (lVar17 = 0; lVar2 + lVar17 <= (long)local_144.bigend.vect[0]; lVar17 = lVar17 + 1
                  ) {
                lVar19 = (long)(((local_144.smallend.vect[0] + -1) - local_d0.begin.x) + (int)lVar17
                               );
                if ((((((~local_d0.p[lVar6 + lVar19 + lVar11].flag & 3) == 0) &&
                      ((~*(uint *)((long)&local_d0.p[lVar2 + (lVar17 - lVar9)].flag + lVar7 + lVar14
                                  ) & 3) == 0)) &&
                     ((~local_d0.p[lVar16 + lVar19 + lVar11].flag & 3) == 0)) &&
                    (((~*(uint *)((long)&local_d0.p[lVar2 + (lVar17 - lVar9)].flag + lVar3 + lVar14)
                      & 3) == 0 && ((~local_d0.p[lVar6 + lVar19 + lVar12].flag & 3) == 0)))) &&
                   (((~*(uint *)((long)&local_d0.p[lVar2 + (lVar17 - lVar9)].flag + lVar4 + lVar7) &
                     3) == 0 &&
                    (((~local_d0.p[lVar16 + lVar19 + lVar12].flag & 3) == 0 &&
                     ((~*(uint *)((long)&local_d0.p[lVar2 + (lVar17 - lVar9)].flag + lVar4 + lVar3)
                      & 3) == 0)))))) {
                  *(double *)
                   ((long)local_128.p +
                   lVar17 * 8 +
                   local_128.nstride * local_188 +
                   (lVar18 - local_128.begin.y) * local_128.jstride * 8 +
                   (lVar10 - local_128.begin.z) * local_128.kstride * 8 +
                   (long)local_128.begin.x * -8 + lVar2 * 8) = vals_dv.m_data[uVar5];
                }
              }
              iVar8 = iVar8 + 1;
            }
            local_1d8 = local_1d8 + 1;
          }
          local_188 = local_188 + 8;
        }
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    PODVector<double,_std::allocator<double>_>::~PODVector(&vals_dv);
  }
  return;
}

Assistant:

void
EB_set_covered (MultiFab& mf, int icomp, int ncomp, int ngrow, const Vector<Real>& a_vals)
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(mf.Factory()));
    if (factory == nullptr) return;
    const auto& flags = factory->getMultiEBCellFlagFab();

    AMREX_ALWAYS_ASSERT(mf.ixType().cellCentered() || mf.ixType().nodeCentered());
    bool is_cell_centered = mf.ixType().cellCentered();
    int ng = std::min(mf.nGrow(),ngrow);

    Gpu::DeviceVector<Real> vals_dv(a_vals.size());
    Gpu::copy(Gpu::hostToDevice, a_vals.begin(), a_vals.end(), vals_dv.begin());
    Real const* AMREX_RESTRICT vals = vals_dv.data();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        const auto& flagarr = flags.const_array(mfi);
        Array4<Real> const& arr = mf.array(mfi);

        if (is_cell_centered) {
            AMREX_HOST_DEVICE_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flagarr(i,j,k).isCovered()) {
                    arr(i,j,k,n+icomp) = vals[n];
                }
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D (bx, ncomp, i, j, k, n,
            {
                eb_set_covered_nodes(i,j,k,n,icomp,arr,flagarr,vals);
            });
        }
    }
}